

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  cpp_dec_float<50U,_int,_void> *this_01;
  uint *puVar1;
  Status stat;
  undefined8 uVar2;
  pointer pnVar3;
  SPxOut *pSVar4;
  ostream *poVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  long_long_type lVar9;
  fpclass_type fVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  cpp_dec_float<50U,_int,_void> vv;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  int local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  Verbosity local_ec;
  DIdxSet *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  leavetol(&local_e0,this);
  this->m_pricingViolCoUpToDate = true;
  this_00 = &this->m_pricingViolCo;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&this_00->m_backend,0);
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_128,(long)(this->thevectors->set).thenum,(type *)0x0);
  if (&local_a8 != &(this->sparsePricingFactor).m_backend) {
    uVar2 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 8);
    local_a8.data._M_elems._32_5_ = SUB85(uVar2,0);
    local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_a8.data._M_elems._0_8_ =
         *(undefined8 *)(this->sparsePricingFactor).m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 2);
    local_a8.data._M_elems._16_8_ =
         *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 4);
    uVar2 = *(undefined8 *)((this->sparsePricingFactor).m_backend.data._M_elems + 6);
    local_a8.data._M_elems._24_5_ = SUB85(uVar2,0);
    local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_a8.exp = (this->sparsePricingFactor).m_backend.exp;
    local_a8.neg = (this->sparsePricingFactor).m_backend.neg;
    local_a8.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_a8.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_128);
  lVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_signed_long_long
                    (&local_a8);
  lVar14 = -0x80000000;
  if (-0x80000000 < lVar9) {
    lVar14 = lVar9;
  }
  if (0x7ffffffe < lVar14) {
    lVar14 = 0x7fffffff;
  }
  if (0 < (this->thevectors->set).thenum) {
    local_e8 = &this->infeasibilitiesCo;
    lVar13 = 0;
    lVar12 = 0;
    do {
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.stat)->data[lVar12];
      if (this->theRep * stat < 1) {
        test((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_128,this,(int)lVar12,stat);
        pnVar3 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar13 + 0x20) =
             local_128.data._M_elems._32_8_;
        puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar13 + 0x10);
        *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._24_8_;
        puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar13);
        *(undefined8 *)puVar1 = local_128.data._M_elems._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._8_8_;
        *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar13) = local_128.exp;
        *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar13 + 4U) = local_128.neg;
        *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar13 + 8U) = local_128._48_8_;
        pnVar3 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_01 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pnVar3->m_backend).data._M_elems + lVar13);
        local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
        uVar7 = local_128.data._M_elems[0];
        fVar10 = local_e0.m_backend.fpclass;
        if (this->remainingRoundsEnterCo == 0) {
          local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_e0.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_e0.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_e0.m_backend.data._M_elems[3];
          local_128.data._M_elems[8] = local_e0.m_backend.data._M_elems[8];
          local_128.data._M_elems[9] = local_e0.m_backend.data._M_elems[9];
          local_128.data._M_elems[4] = local_e0.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_e0.m_backend.data._M_elems[5];
          local_128.data._M_elems[6] = local_e0.m_backend.data._M_elems[6];
          local_128.data._M_elems[7] = local_e0.m_backend.data._M_elems[7];
          local_128.exp = local_e0.m_backend.exp;
          local_128.neg = local_e0.m_backend.neg;
          local_128.fpclass = local_e0.m_backend.fpclass;
          local_128.prec_elem = local_e0.m_backend.prec_elem;
          if (uVar7 != 0 || fVar10 != cpp_dec_float_finite) {
            local_128.neg = (bool)(local_e0.m_backend.neg ^ 1);
          }
          if (((fVar10 == cpp_dec_float_NaN) ||
              (*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar13 + 8U) == 2)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (this_01,&local_128), -1 < iVar8)) {
            (this->isInfeasibleCo).data[lVar12] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->theTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar13));
            DIdxSet::addIdx(local_e8,(int)lVar12);
            (this->isInfeasibleCo).data[lVar12] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if ((int)lVar14 < (this->infeasibilitiesCo).super_IdxSet.num) {
            pSVar4 = this->spxout;
            if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
              local_128.data._M_elems[0] = pSVar4->m_verbosity;
              local_a8.data._M_elems[0] = 4;
              (*pSVar4->_vptr_SPxOut[2])(pSVar4,&local_a8);
              pSVar4 = this->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar4->m_streams[pSVar4->m_verbosity]," --- using dense pricing",0x18);
              cVar6 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                              cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_128);
            }
            this->remainingRoundsEnterCo = 5;
            this->sparsePricingEnterCo = false;
            (this->infeasibilitiesCo).super_IdxSet.num = 0;
          }
        }
        else {
          local_128.data._M_elems[0] = local_e0.m_backend.data._M_elems[0];
          local_128.data._M_elems[1] = local_e0.m_backend.data._M_elems[1];
          local_128.data._M_elems[2] = local_e0.m_backend.data._M_elems[2];
          local_128.data._M_elems[3] = local_e0.m_backend.data._M_elems[3];
          local_128.data._M_elems[8] = local_e0.m_backend.data._M_elems[8];
          local_128.data._M_elems[9] = local_e0.m_backend.data._M_elems[9];
          local_128.data._M_elems[4] = local_e0.m_backend.data._M_elems[4];
          local_128.data._M_elems[5] = local_e0.m_backend.data._M_elems[5];
          local_128.data._M_elems[6] = local_e0.m_backend.data._M_elems[6];
          local_128.data._M_elems[7] = local_e0.m_backend.data._M_elems[7];
          local_128.exp = local_e0.m_backend.exp;
          local_128.neg = local_e0.m_backend.neg;
          local_128.fpclass = local_e0.m_backend.fpclass;
          local_128.prec_elem = local_e0.m_backend.prec_elem;
          if (uVar7 != 0 || fVar10 != cpp_dec_float_finite) {
            local_128.neg = (bool)(local_e0.m_backend.neg ^ 1);
          }
          if (((fVar10 != cpp_dec_float_NaN) &&
              (*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar13 + 8U) != 2)) &&
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (this_01,&local_128), iVar8 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->theTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar13));
            this->m_numViol = this->m_numViol + 1;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)(((this->theTest).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar13),0.0);
        if (this->remainingRoundsEnterCo == 0) {
          (this->isInfeasibleCo).data[lVar12] = 0;
        }
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < (this->thevectors->set).thenum);
  }
  iVar8 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar8 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar8 <= (int)lVar14) && (this->sparsePricingEnterCo == false)) {
    pSVar4 = this->spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (local_ec = pSVar4->m_verbosity, 3 < (int)local_ec)) {
      local_128.data._M_elems[0] = 4;
      (*pSVar4->_vptr_SPxOut[2])();
      poVar5 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar2 = *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar11 = " --- using hypersparse pricing, ";
        lVar14 = 0x20;
      }
      else {
        pcVar11 = " --- using sparse pricing, ";
        lVar14 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar14);
      pSVar4 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity],"sparsity: ",10);
      poVar5 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar14 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar14 + -0x18) + 0x10) = 6;
      *(uint *)(poVar5 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar5 + *(long *)(lVar14 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a8,(long)(this->infeasibilitiesCo).super_IdxSet.num,(type *)0x0);
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_128,(long)(this->thevectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_68,&local_a8,&local_128);
      boost::multiprecision::operator<<
                (pSVar4->m_streams[pSVar4->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_68);
      poVar5 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar14 = *(long *)poVar5;
      *(uint *)(poVar5 + *(long *)(lVar14 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar14 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_130 = (int)uVar2;
      *(long *)(poVar5 + *(long *)(lVar14 + -0x18) + 8) = (long)local_130;
      std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_ec);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}